

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::recoverFromError(OurReader *this,TokenType skipUntilToken)

{
  _Map_pointer ppEVar1;
  bool bVar2;
  size_type __new_size;
  Token skip;
  Token local_40;
  
  ppEVar1 = (this->errors_).
            super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  __new_size = ((long)(this->errors_).
                      super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->errors_).
                      super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 6) +
               ((long)(this->errors_).
                      super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->errors_).
                      super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 6) +
               ((long)ppEVar1 +
                ((ulong)(ppEVar1 != (_Map_pointer)0x0) * -8 -
                (long)(this->errors_).
                      super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) & 0xfffffffffffffff8);
  do {
    bVar2 = readToken(this,&local_40);
    if (!bVar2) {
      std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
                (&this->errors_,__new_size);
    }
  } while ((local_40.type_ != skipUntilToken) && (local_40.type_ != tokenEndOfStream));
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
            (&this->errors_,__new_size);
  return false;
}

Assistant:

bool OurReader::recoverFromError(TokenType skipUntilToken) {
  size_t errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}